

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.cpp
# Opt level: O2

Sexp * Builtin_Error(Sexp *form)

{
  Kind KVar1;
  JetRuntimeException *this;
  string local_70;
  string local_50;
  ContractFrameProtector local_30;
  ContractFrameProtector __contract_frame;
  
  ContractFrameProtector::ContractFrameProtector(&local_30,"Builtin_Error");
  ContractFrame::AddContract(local_30.protected_frame,NoGc);
  KVar1 = form->kind;
  this = (JetRuntimeException *)__cxa_allocate_exception(0x28);
  if (KVar1 == STRING) {
    std::__cxx11::string::string
              ((string *)&local_50,(form->field_1).string_value,
               (allocator *)((long)&__contract_frame.protected_frame + 7));
    JetRuntimeException::JetRuntimeException(this,&local_50);
    __cxa_throw(this,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
  }
  std::__cxx11::string::string
            ((string *)&local_70,"error called with non-string value",
             (allocator *)((long)&__contract_frame.protected_frame + 7));
  JetRuntimeException::JetRuntimeException(this,&local_70);
  __cxa_throw(this,&JetRuntimeException::typeinfo,JetRuntimeException::~JetRuntimeException);
}

Assistant:

Sexp *Builtin_Error(Sexp *form) {
  CONTRACT { FORBID_GC; }